

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringlib.c
# Opt level: O0

stringlib_tokens_t * stringlib_splitTokens(char *str,char chr)

{
  stringlib_tokens_t *psVar1;
  stringlib_tokens_t *psVar2;
  s_stringlib_token *psVar3;
  char in_SIL;
  char *in_RDI;
  stringlib_tokens_t *newToken;
  stringlib_tokens_t *currentToken;
  stringlib_tokens_t *tokens;
  char *newPos;
  char *lastPos;
  stringlib_tokens_t *local_30;
  stringlib_tokens_t *local_28;
  char *local_20;
  char *local_18;
  
  local_28 = (stringlib_tokens_t *)0x0;
  local_18 = in_RDI;
  for (local_20 = in_RDI; *local_20 != '\0'; local_20 = local_20 + 1) {
    if (*local_20 == in_SIL) {
      psVar2 = (stringlib_tokens_t *)malloc(0x18);
      psVar2->next = (s_stringlib_token *)0x0;
      psVar1 = psVar2;
      if (local_28 != (stringlib_tokens_t *)0x0) {
        local_30->next = psVar2;
        psVar1 = local_28;
      }
      local_28 = psVar1;
      psVar2->start = (long)local_18 - (long)in_RDI;
      psVar2->length = (long)local_20 - (long)local_18;
      local_18 = local_20 + 1;
      local_30 = psVar2;
    }
  }
  if (local_20 != in_RDI) {
    psVar3 = (s_stringlib_token *)malloc(0x18);
    psVar3->next = (s_stringlib_token *)0x0;
    psVar1 = psVar3;
    if (local_28 != (stringlib_tokens_t *)0x0) {
      local_30->next = psVar3;
      psVar1 = local_28;
    }
    local_28 = psVar1;
    psVar3->start = (long)local_18 - (long)in_RDI;
    psVar3->length = (long)local_20 - (long)local_18;
  }
  return local_28;
}

Assistant:

stringlib_tokens_t *stringlib_splitTokens(char *str, char chr) {
	char *lastPos;
	char *newPos;

	stringlib_tokens_t *tokens = NULL;
	stringlib_tokens_t *currentToken;
	stringlib_tokens_t *newToken;

	newPos = str;
	lastPos = str;

	while ( *newPos != '\0' ) {
		if ( *newPos == chr ) {
			newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
			newToken->next = NULL;

			if ( tokens == NULL ) {
				tokens = newToken;
				currentToken = newToken;
			} else {
				currentToken->next = newToken;
				currentToken = newToken;
			}

			currentToken->start = ( lastPos - str );
			currentToken->length = ( newPos - lastPos );
			lastPos = newPos + 1;
		}
		newPos++;
	}
	if ( newPos != str ) {
		newToken = (stringlib_tokens_t *) malloc(sizeof(stringlib_tokens_t));
		newToken->next = NULL;

		if ( tokens == NULL ) {
			tokens = newToken;
			currentToken = newToken;
		} else {
			currentToken->next = newToken;
			currentToken = newToken;
		}

		currentToken->start = ( lastPos - str );
		currentToken->length = ( newPos - lastPos );
	}
	return tokens;
}